

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

shared_ptr<mcc::DeclList> __thiscall mcc::Parser::DeclarationList(Parser *this)

{
  bool bVar1;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TokenType type_00;
  Parser *in_RSI;
  shared_ptr<mcc::DeclList> sVar2;
  allocator<char> local_191;
  string local_190 [32];
  undefined1 local_170 [23];
  bool local_159;
  shared_ptr<mcc::Token> local_158;
  undefined1 local_148 [8];
  shared_ptr<mcc::Expr> init;
  undefined1 local_130 [32];
  string local_110 [32];
  undefined1 local_f0 [24];
  string local_d8 [32];
  undefined1 local_b8 [8];
  shared_ptr<mcc::Token> len;
  string local_a0 [32];
  undefined1 local_80 [8];
  shared_ptr<mcc::Token> name;
  Type type;
  undefined1 local_40 [8];
  shared_ptr<mcc::Token> token;
  vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  var_decl_list;
  Parser *this_local;
  
  std::vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>::
  vector((vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_> *)
         &token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Peek((Parser *)local_40);
  ParsePrim((Type *)&name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
            in_RSI);
  do {
    ParsePtr(in_RSI,(Type *)&name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_a0,"Expected identifier after type declaration",
               (allocator<char> *)
               ((long)&len.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi + 7));
    type_00 = (TokenType)in_RSI;
    Consume((Parser *)local_80,type_00,(string *)0x30);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&len.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi + 7));
    bVar1 = Match(in_RSI,T_LBRACKET);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_d8,"Expected integer length > 0",(allocator<char> *)(local_f0 + 0x17));
      Consume((Parser *)local_b8,type_00,(string *)0x2e);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)(local_f0 + 0x17));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_110,"Expected \']\' after array length declaration",
                 (allocator<char> *)(local_130 + 0x1f));
      Consume((Parser *)local_f0,type_00,(string *)0xc);
      std::shared_ptr<mcc::Token>::~shared_ptr((shared_ptr<mcc::Token> *)local_f0);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)(local_130 + 0x1f));
      this_00 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_b8);
      Token::Int(this_00);
      local_130._0_8_ = (element_type *)0x0;
      init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
      init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
      std::
      make_shared<mcc::VarDecl,std::shared_ptr<mcc::Token>&,decltype(nullptr),mcc::Type&,bool,bool>
                ((shared_ptr<mcc::Token> *)(local_130 + 8),(void **)local_80,(Type *)local_130,
                 (bool *)&name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                 (bool *)((long)&init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
      std::vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>::
      push_back((vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
                 *)&token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                (value_type *)(local_130 + 8));
      std::shared_ptr<mcc::VarDecl>::~shared_ptr((shared_ptr<mcc::VarDecl> *)(local_130 + 8));
      std::shared_ptr<mcc::Token>::~shared_ptr((shared_ptr<mcc::Token> *)local_b8);
    }
    else {
      OptionalExpression((Parser *)local_148,type_00);
      local_159 = false;
      local_170[0x16] = 1;
      std::
      make_shared<mcc::VarDecl,std::shared_ptr<mcc::Token>&,std::shared_ptr<mcc::Expr>&,mcc::Type&,bool,bool>
                (&local_158,(shared_ptr<mcc::Expr> *)local_80,(Type *)local_148,
                 (bool *)&name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&local_159);
      std::vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>::
      push_back((vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
                 *)&token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                (value_type *)&local_158);
      std::shared_ptr<mcc::VarDecl>::~shared_ptr((shared_ptr<mcc::VarDecl> *)&local_158);
      std::shared_ptr<mcc::Expr>::~shared_ptr((shared_ptr<mcc::Expr> *)local_148);
    }
    std::shared_ptr<mcc::Token>::~shared_ptr((shared_ptr<mcc::Token> *)local_80);
    bVar1 = Match(in_RSI,T_COMMA);
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_190,"Expected \';\' after variable declaration",&local_191);
  Consume((Parser *)local_170,type_00,(string *)0x6);
  std::shared_ptr<mcc::Token>::~shared_ptr((shared_ptr<mcc::Token> *)local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::
  make_shared<mcc::DeclList,std::shared_ptr<mcc::Token>,std::vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>&>
            ((shared_ptr<mcc::Token> *)this,
             (vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
              *)local_40);
  Type::~Type((Type *)&name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<mcc::Token>::~shared_ptr((shared_ptr<mcc::Token> *)local_40);
  std::vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>::
  ~vector((vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_> *)
          &token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mcc::DeclList>)
         sVar2.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DeclList> Parser::DeclarationList() {
  std::vector<std::shared_ptr<VarDecl>> var_decl_list;
  std::shared_ptr<Token> token = Peek();
  Type type = ParsePrim();

  do {
    ParsePtr(type);
    std::shared_ptr<Token> name = Consume(TokenType::T_IDENTIFIER,"Expected identifier after type declaration");
    if (Match(TokenType::T_LBRACKET)) {
      std::shared_ptr<Token> len = Consume(TokenType::T_INT_LIT, "Expected integer length > 0");
      Consume(TokenType::T_RBRACKET, "Expected ']' after array length declaration");
      type.len = len->Int();
      var_decl_list.push_back(std::make_shared<VarDecl>(name, nullptr, type, false, true));
      type.len = 0;
    } else {
      std::shared_ptr<Expr> init = OptionalExpression(0);
      var_decl_list.push_back(std::make_shared<VarDecl>(name, init, type, false, true));
    }
  } while (Match(TokenType::T_COMMA));

  Consume(TokenType::T_SEMICOLON, "Expected ';' after variable declaration");
  return std::make_shared<DeclList>(std::move(token), var_decl_list);
}